

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCompiler.cpp
# Opt level: O0

void __thiscall Refal2::CLeftPartCompiler::matchLeftParens(CLeftPartCompiler *this)

{
  CNodeType *nodeAfter;
  CNodeType *this_00;
  CNodeType *toNode;
  CUnitNode **ppCVar1;
  CNode<Refal2::CUnit> *fromNode;
  CHole local_78;
  undefined1 local_48 [8];
  CUnitList newHole;
  CUnitNode *endNew;
  CUnitNode *beginNew;
  CUnitNode *end;
  CUnitNode *begin;
  CLeftPartCompiler *this_local;
  
  COperationsBuilder::AddMatchLeftParens((COperationsBuilder *)this);
  this_00 = CNodeList<Refal2::CUnit>::GetFirst((CNodeList<Refal2::CUnit> *)this->hole);
  toNode = CNodeList<Refal2::CUnit>::GetLast((CNodeList<Refal2::CUnit> *)this->hole);
  ppCVar1 = CUnit::PairedParen(&this_00->super_CUnit);
  fromNode = CNode<Refal2::CUnit>::Next(*ppCVar1);
  newHole.super_CNodeList<Refal2::CUnit>.last = (CNodeType *)0x0;
  CUnitList::CUnitList((CUnitList *)local_48);
  if (fromNode != (CNode<Refal2::CUnit> *)0x0) {
    newHole.super_CNodeList<Refal2::CUnit>.last = toNode;
    CNodeList<Refal2::CUnit>::Detach((CNodeList<Refal2::CUnit> *)this->hole,fromNode,toNode);
    CNodeList<Refal2::CUnit>::Assign
              ((CNodeList<Refal2::CUnit> *)local_48,fromNode,
               newHole.super_CNodeList<Refal2::CUnit>.last);
  }
  CNodeList<Refal2::CUnit>::RemoveFirst((CNodeList<Refal2::CUnit> *)this->hole);
  CNodeList<Refal2::CUnit>::RemoveLast((CNodeList<Refal2::CUnit> *)this->hole);
  nodeAfter = this->hole;
  CHole::CHole(&local_78,(CUnitList *)local_48,this->top,this->top + 1);
  CNodeList<Refal2::CHole>::InsertAfter(&this->holes,nodeAfter,&local_78);
  CHole::~CHole(&local_78);
  this->top = this->top + 2;
  CUnitList::~CUnitList((CUnitList *)local_48);
  return;
}

Assistant:

void CLeftPartCompiler::matchLeftParens()
{
	COperationsBuilder::AddMatchLeftParens();
	
	CUnitNode* begin = hole->GetFirst();
	CUnitNode* end = hole->GetLast();
	CUnitNode* beginNew = begin->PairedParen()->Next();
	CUnitNode* endNew = 0;

	CUnitList newHole;
	if( beginNew != 0 ) {
		endNew = end;
		hole->Detach( beginNew, endNew );
		newHole.Assign( beginNew, endNew );
	}
	
	hole->RemoveFirst();
	hole->RemoveLast();

	holes.InsertAfter( hole, CHole( newHole, top, top + 1 ) );
	top += 2;
}